

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                 (RepeatedField<long> *value,size_t tag_size,CachedSize *cached_size)

{
  long lVar1;
  int iVar2;
  ulong *puVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  int index;
  
  iVar2 = SooRep::size(&value->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
  if (iVar2 == 0) {
    if (cached_size->atom_ != 0) {
      cached_size->atom_ = 0;
    }
    sVar5 = 0;
  }
  else {
    iVar2 = SooRep::size(&value->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
    index = 0;
    if (iVar2 < 1) {
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      do {
        puVar3 = (ulong *)RepeatedField<long>::Get(value,index);
        lVar1 = 0x3f;
        if ((*puVar3 | 1) != 0) {
          for (; (*puVar3 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        lVar6 = lVar6 + (ulong)((int)lVar1 * 9 + 0x49U >> 6);
        index = index + 1;
      } while (iVar2 != index);
    }
    CachedSize::SetNonZero(cached_size,(int)lVar6);
    uVar4 = (long)(int)lVar6 | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar5 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + tag_size + lVar6;
  }
  return sVar5;
}

Assistant:

size_t WireFormatLite::Int64SizeWithPackedTagSize(
    const RepeatedField<int64_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = Int64Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}